

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O3

void __thiscall
capnp::_::anon_unknown_0::TestRpcEnv::TestRpcEnv
          (TestRpcEnv *this,Maybe<kj::Promise<void>_> *revokePromise)

{
  AsyncIoStream *connection;
  _func_int *p_Var1;
  Connection CVar2;
  WindowGetter WVar3;
  undefined8 uVar4;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 node;
  ClientHook *pCVar5;
  MembranePolicy *pMVar6;
  int iVar7;
  bool bVar8;
  Client CVar9;
  undefined1 local_c0 [8];
  Connection local_b8;
  WindowGetter local_b0;
  undefined1 local_a8 [16];
  Maybe<kj::Promise<void>_> local_98;
  Client local_88;
  Own<capnp::MembranePolicy,_std::nullptr_t> local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  void *local_58;
  OwnPromiseNode local_48;
  ArrayDisposer *pAStack_40;
  
  kj::EventLoop::EventLoop(&this->loop);
  (this->waitScope).loop = &this->loop;
  (this->waitScope).busyPollInterval = 0xffffffff;
  (this->waitScope).fiber.ptr = (FiberBase *)0x0;
  (this->waitScope).runningStacksPool.ptr = (FiberPool *)0x0;
  kj::EventLoop::enterScope(&this->loop);
  kj::newTwoWayPipe();
  TwoPartyClient::TwoPartyClient(&this->client,(this->pipe).ends[0].ptr);
  connection = (this->pipe).ends[1].ptr;
  local_a8._8_8_ = operator_new(0x18);
  *(undefined8 *)&(((TestMembraneImpl *)local_a8._8_8_)->super_Server).field_0x10 = 0;
  (((TestMembraneImpl *)local_a8._8_8_)->super_Server)._vptr_Server = (_func_int **)0x6b7810;
  *(undefined8 *)&(((TestMembraneImpl *)local_a8._8_8_)->super_Server).field_0x8 = 0x6b7868;
  local_a8._0_8_ = &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestMembraneImpl>::instance
  ;
  pMVar6 = (MembranePolicy *)operator_new(0xc0);
  kj::Maybe<kj::Promise<void>_>::Maybe(&local_98,revokePromise);
  (pMVar6->wrappers).table.rows.builder.ptr = (Entry *)0x0;
  (pMVar6->wrappers).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *)0x0;
  (pMVar6->wrappers).table.rows.builder.endPtr = (Entry *)0x0;
  (pMVar6->wrappers).table.rows.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance
  ;
  (pMVar6->wrappers).table.indexes.erasedCount = 0;
  (pMVar6->wrappers).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (pMVar6->wrappers).table.indexes.buckets.size_ = 0;
  (pMVar6->wrappers).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (pMVar6->reverseWrappers).table.rows.builder.ptr = (Entry *)0x0;
  (pMVar6->reverseWrappers).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *)0x0;
  (pMVar6->reverseWrappers).table.rows.builder.endPtr = (Entry *)0x0;
  (pMVar6->reverseWrappers).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (pMVar6->reverseWrappers).table.indexes.erasedCount = 0;
  (pMVar6->reverseWrappers).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (pMVar6->reverseWrappers).table.indexes.buckets.size_ = 0;
  (pMVar6->reverseWrappers).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  *(undefined4 *)&pMVar6[1].wrappers.table.rows.builder.ptr = 0;
  pMVar6->_vptr_MembranePolicy = (_func_int **)&PTR_inboundCall_006b7670;
  pMVar6[1]._vptr_MembranePolicy = (_func_int **)&PTR_disposeImpl_006b76e8;
  bVar8 = local_98.ptr.isSet != true;
  if (bVar8) {
    iVar7 = 1;
  }
  else {
    local_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/membrane-test.c++"
    ;
    uStack_60 = "operator()";
    local_58 = (void *)0x4b00000065;
    kj::Promise<void>::fork((Promise<void> *)&local_48);
    pMVar6[1].wrappers.table.rows.builder.endPtr = (Entry *)local_48.ptr;
    pMVar6[1].wrappers.table.rows.builder.disposer = pAStack_40;
    iVar7 = *(int *)&pMVar6[1].wrappers.table.rows.builder.ptr + 1;
  }
  node = local_98.ptr.field_1;
  *(bool *)&pMVar6[1].wrappers.table.rows.builder.pos = !bVar8;
  *(int *)&pMVar6[1].wrappers.table.rows.builder.ptr = iVar7;
  if (((local_98.ptr.isSet & 1U) != 0) &&
     (local_98.ptr.field_1 != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0))
  {
    local_98.ptr.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  }
  local_78.disposer = (Disposer *)(pMVar6 + 1);
  local_78.ptr = pMVar6;
  membrane<capnp::_::(anonymous_namespace)::TestMembraneImpl>
            ((Client *)local_c0,
             (Own<capnp::_::(anonymous_namespace)::TestMembraneImpl,_std::nullptr_t> *)local_a8,
             &local_78);
  p_Var1 = *(_func_int **)((long)local_c0 + -0x18);
  local_88.hook.disposer = *(Disposer **)(local_c0 + (long)p_Var1);
  local_88.hook.ptr = *(ClientHook **)(p_Var1 + (long)&local_b8._vptr_Connection);
  *(undefined8 *)(p_Var1 + (long)&local_b8._vptr_Connection) = 0;
  TwoPartyClient::TwoPartyClient(&this->server,connection,&local_88,SERVER);
  pCVar5 = local_88.hook.ptr;
  if (local_88.hook.ptr != (ClientHook *)0x0) {
    local_88.hook.ptr = (ClientHook *)0x0;
    (**(local_88.hook.disposer)->_vptr_Disposer)
              (local_88.hook.disposer,
               (_func_int *)((long)&pCVar5->_vptr_ClientHook + (long)pCVar5->_vptr_ClientHook[-2]));
  }
  WVar3._vptr_WindowGetter = local_b0._vptr_WindowGetter;
  if (local_b0._vptr_WindowGetter != (_func_int **)0x0) {
    local_b0._vptr_WindowGetter = (_func_int **)0x0;
    (**(code **)*local_b8._vptr_Connection)
              (local_b8._vptr_Connection,
               (long)WVar3._vptr_WindowGetter + *(long *)(*WVar3._vptr_WindowGetter + -0x10));
  }
  pMVar6 = local_78.ptr;
  if (local_78.ptr != (MembranePolicy *)0x0) {
    local_78.ptr = (MembranePolicy *)0x0;
    (**(local_78.disposer)->_vptr_Disposer)
              (local_78.disposer,
               (_func_int *)
               ((long)&pMVar6->_vptr_MembranePolicy + (long)pMVar6->_vptr_MembranePolicy[-2]));
  }
  uVar4 = local_a8._8_8_;
  if ((TestMembraneImpl *)local_a8._8_8_ != (TestMembraneImpl *)0x0) {
    local_a8._8_8_ = (TestMembraneImpl *)0x0;
    (***(_func_int ***)local_a8._0_8_)(local_a8._0_8_,uVar4 + *(long *)(*(long *)uVar4 + -0x10));
  }
  CVar9 = TwoPartyClient::bootstrap((TwoPartyClient *)local_c0);
  (**(code **)(*local_b8._vptr_Connection + 0x20))
            (&local_68,local_b8._vptr_Connection,CVar9.hook.ptr);
  CVar2._vptr_Connection = local_b8._vptr_Connection;
  *(undefined4 *)&(this->membraned).field_0x8 = (undefined4)local_68;
  *(undefined4 *)&(this->membraned).field_0xc = local_68._4_4_;
  *(undefined4 *)&(this->membraned).field_0x10 = (undefined4)uStack_60;
  *(undefined4 *)&(this->membraned).field_0x14 = uStack_60._4_4_;
  (this->membraned)._vptr_Client =
       (_func_int **)&capnproto_test::capnp::test::TestMembrane::Client::typeinfo;
  if (local_b8._vptr_Connection != (_func_int **)0x0) {
    local_b8._vptr_Connection = (_func_int **)0x0;
    (**(code **)*(_func_int **)local_c0)
              (local_c0,(long)CVar2._vptr_Connection + *(long *)(*CVar2._vptr_Connection + -0x10));
  }
  return;
}

Assistant:

TestRpcEnv(kj::Maybe<kj::Promise<void>> revokePromise = kj::none)
      : waitScope(loop),
        pipe(kj::newTwoWayPipe()),
        client(*pipe.ends[0]),
        server(*pipe.ends[1],
               membrane(kj::heap<TestMembraneImpl>(),
                        kj::refcounted<MembranePolicyImpl>(kj::mv(revokePromise))),
               rpc::twoparty::Side::SERVER),
        membraned(client.bootstrap().castAs<test::TestMembrane>()) {}